

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaAllocator_T::PrintDetailedMap(VmaAllocator_T *this,VmaJsonWriter *json)

{
  bool bVar1;
  uint32_t uVar2;
  ItemType *this_00;
  VmaJsonWriter *this_01;
  VmaJsonWriter *in_RSI;
  VmaAllocator_T *in_RDI;
  VmaBlockVector *blockVector;
  VmaPool pool;
  size_t index;
  bool displayType;
  uint32_t memTypeIndex_1;
  VmaMutexLockRead lock;
  VmaDedicatedAllocationList *dedicatedAllocList;
  VmaBlockVector *pBlockVector;
  uint32_t memTypeIndex;
  ItemType *in_stack_ffffffffffffff38;
  VmaJsonWriter *in_stack_ffffffffffffff40;
  VmaRWMutex *in_stack_ffffffffffffff48;
  undefined1 singleLine;
  VmaJsonWriter *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  VmaDedicatedAllocationList *in_stack_ffffffffffffff70;
  VmaJsonWriter *in_stack_ffffffffffffffa8;
  ItemType *this_02;
  ItemType *this_03;
  VmaBlockVector *in_stack_ffffffffffffffb0;
  VmaBlockVector *pVVar3;
  uint local_40;
  uint local_14;
  
  VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  VmaJsonWriter::BeginObject
            (in_stack_ffffffffffffff50,SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  for (local_14 = 0; uVar2 = GetMemoryTypeCount(in_RDI), local_14 < uVar2; local_14 = local_14 + 1)
  {
    pVVar3 = in_RDI->m_pBlockVectors[local_14];
    if (pVVar3 != (VmaBlockVector *)0x0) {
      VmaJsonWriter::BeginString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      VmaJsonWriter::ContinueString
                (in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      VmaJsonWriter::EndString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      VmaJsonWriter::BeginObject
                (in_stack_ffffffffffffff50,SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
      VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      VmaBlockVector::GetPreferredBlockSize(pVVar3);
      VmaJsonWriter::WriteNumber(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
      VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      VmaBlockVector::PrintDetailedMap(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      VmaDedicatedAllocationList::BuildStatsString
                (in_stack_ffffffffffffff70,
                 (VmaJsonWriter *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      VmaJsonWriter::EndObject(in_stack_ffffffffffffff40);
    }
  }
  VmaJsonWriter::EndObject(in_stack_ffffffffffffff40);
  VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  VmaJsonWriter::BeginObject
            (in_stack_ffffffffffffff50,SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  VmaMutexLockRead::VmaMutexLockRead
            ((VmaMutexLockRead *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
  bVar1 = VmaIntrusiveLinkedList<VmaPoolListItemTraits>::IsEmpty(&in_RDI->m_Pools);
  if (!bVar1) {
    for (local_40 = 0; uVar2 = GetMemoryTypeCount(in_RDI), local_40 < uVar2; local_40 = local_40 + 1
        ) {
      bVar1 = true;
      pVVar3 = (VmaBlockVector *)0x0;
      this_00 = VmaIntrusiveLinkedList<VmaPoolListItemTraits>::Front(&in_RDI->m_Pools);
      this_02 = this_00;
      while (this_02 != (ItemType *)0x0) {
        this_03 = this_02;
        uVar2 = VmaBlockVector::GetMemoryTypeIndex(&this_02->m_BlockVector);
        singleLine = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
        if (uVar2 == local_40) {
          if (bVar1) {
            VmaJsonWriter::BeginString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
            VmaJsonWriter::ContinueString
                      (in_stack_ffffffffffffff40,
                       (uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
            VmaJsonWriter::EndString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
            VmaJsonWriter::BeginArray(in_stack_ffffffffffffff50,(bool)singleLine);
            bVar1 = false;
          }
          VmaJsonWriter::BeginObject(in_stack_ffffffffffffff50,(bool)singleLine);
          VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          VmaJsonWriter::BeginString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          pVVar3 = (VmaBlockVector *)((long)&pVVar3->m_hAllocator + 1);
          VmaJsonWriter::ContinueString_Size
                    (in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
          this_01 = (VmaJsonWriter *)VmaPool_T::GetName(this_03);
          if (this_01 != (VmaJsonWriter *)0x0) {
            VmaJsonWriter::ContinueString(this_01,in_stack_ffffffffffffff58);
            in_stack_ffffffffffffff50 = in_RSI;
            in_stack_ffffffffffffff58 = VmaPool_T::GetName(this_03);
            VmaJsonWriter::ContinueString(this_01,in_stack_ffffffffffffff58);
          }
          VmaJsonWriter::EndString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff40 = in_RSI;
          in_stack_ffffffffffffff48 =
               (VmaRWMutex *)VmaBlockVector::GetPreferredBlockSize(&this_02->m_BlockVector);
          VmaJsonWriter::WriteNumber(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
          VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          VmaBlockVector::PrintDetailedMap(pVVar3,(VmaJsonWriter *)this_03);
          VmaJsonWriter::WriteString(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          VmaDedicatedAllocationList::BuildStatsString
                    ((VmaDedicatedAllocationList *)this_00,
                     (VmaJsonWriter *)CONCAT44(uVar2,in_stack_ffffffffffffff68));
          VmaJsonWriter::EndObject(in_stack_ffffffffffffff40);
        }
        in_stack_ffffffffffffff38 =
             VmaIntrusiveLinkedList<VmaPoolListItemTraits>::GetNext((ItemType *)0x301447);
        this_02 = in_stack_ffffffffffffff38;
      }
      if (!bVar1) {
        VmaJsonWriter::EndArray(in_stack_ffffffffffffff40);
      }
    }
  }
  VmaMutexLockRead::~VmaMutexLockRead((VmaMutexLockRead *)in_stack_ffffffffffffff40);
  VmaJsonWriter::EndObject(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void VmaAllocator_T::PrintDetailedMap(VmaJsonWriter& json)
{
    json.WriteString("DefaultPools");
    json.BeginObject();
    {
        for (uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
        {
            VmaBlockVector* pBlockVector = m_pBlockVectors[memTypeIndex];
            VmaDedicatedAllocationList& dedicatedAllocList = m_DedicatedAllocations[memTypeIndex];
            if (pBlockVector != VMA_NULL)
            {
                json.BeginString("Type ");
                json.ContinueString(memTypeIndex);
                json.EndString();
                json.BeginObject();
                {
                    json.WriteString("PreferredBlockSize");
                    json.WriteNumber(pBlockVector->GetPreferredBlockSize());

                    json.WriteString("Blocks");
                    pBlockVector->PrintDetailedMap(json);

                    json.WriteString("DedicatedAllocations");
                    dedicatedAllocList.BuildStatsString(json);
                }
                json.EndObject();
            }
        }
    }
    json.EndObject();

    json.WriteString("CustomPools");
    json.BeginObject();
    {
        VmaMutexLockRead lock(m_PoolsMutex, m_UseMutex);
        if (!m_Pools.IsEmpty())
        {
            for (uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
            {
                bool displayType = true;
                size_t index = 0;
                for (VmaPool pool = m_Pools.Front(); pool != VMA_NULL; pool = m_Pools.GetNext(pool))
                {
                    VmaBlockVector& blockVector = pool->m_BlockVector;
                    if (blockVector.GetMemoryTypeIndex() == memTypeIndex)
                    {
                        if (displayType)
                        {
                            json.BeginString("Type ");
                            json.ContinueString(memTypeIndex);
                            json.EndString();
                            json.BeginArray();
                            displayType = false;
                        }

                        json.BeginObject();
                        {
                            json.WriteString("Name");
                            json.BeginString();
                            json.ContinueString_Size(index++);
                            if (pool->GetName())
                            {
                                json.ContinueString(" - ");
                                json.ContinueString(pool->GetName());
                            }
                            json.EndString();

                            json.WriteString("PreferredBlockSize");
                            json.WriteNumber(blockVector.GetPreferredBlockSize());

                            json.WriteString("Blocks");
                            blockVector.PrintDetailedMap(json);

                            json.WriteString("DedicatedAllocations");
                            pool->m_DedicatedAllocations.BuildStatsString(json);
                        }
                        json.EndObject();
                    }
                }

                if (!displayType)
                    json.EndArray();
            }
        }
    }
    json.EndObject();
}